

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O0

int uint64_tToString(char *destination,size_t destinationSize,uint64_t value)

{
  char cVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  bool local_3a;
  ulong uStack_38;
  char temp;
  size_t w;
  size_t pos;
  uint64_t uStack_20;
  int result;
  uint64_t value_local;
  size_t destinationSize_local;
  char *destination_local;
  
  if ((destination == (char *)0x0) || (destinationSize < 2)) {
    pos._4_4_ = 0x35e;
  }
  else {
    w = 0;
    sVar3 = w;
    uStack_20 = value;
    do {
      w = sVar3;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uStack_20;
      sVar3 = w + 1;
      destination[w] = SUB161(auVar2 % ZEXT816(10),0) + '0';
      uStack_20 = uStack_20 / 10;
      local_3a = uStack_20 != 0 && sVar3 < destinationSize - 1;
    } while (local_3a);
    if (uStack_20 == 0) {
      destination[sVar3] = '\0';
      for (uStack_38 = 0; uStack_38 <= w >> 1; uStack_38 = uStack_38 + 1) {
        cVar1 = destination[uStack_38];
        destination[uStack_38] = destination[w - uStack_38];
        destination[w - uStack_38] = cVar1;
      }
      pos._4_4_ = 0;
    }
    else {
      pos._4_4_ = 0x379;
    }
  }
  return pos._4_4_;
}

Assistant:

int uint64_tToString(char* destination, size_t destinationSize, uint64_t value)
{
    int result;
    size_t pos;
    /*the below loop gets the number in reverse order*/
    if (
        (destination == NULL) ||
        (destinationSize < 2) /*because the smallest number is '0\0' which requires 2 characters*/
        )
    {
        result = MU_FAILURE;
    }
    else
    {
        pos = 0;
        do
        {
            destination[pos++] = '0' + (value % 10);
            value /= 10;
        } while ((value > 0) && (pos < (destinationSize - 1)));

        if (value == 0)
        {
            size_t w;
            destination[pos] = '\0';
            /*all converted and they fit*/
            for (w = 0; w <= (pos - 1) >> 1; w++)
            {
                char temp;
                temp = destination[w];
                destination[w] = destination[pos - 1 - w];
                destination[pos - 1 - w] = temp;
            }
            result = 0;
        }
        else
        {
            result = MU_FAILURE;
        }
    }
    return result;
}